

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator1.cpp
# Opt level: O1

int main(void)

{
  VisualComponent *pVVar1;
  VisualComponent *this;
  BorderDecorator *this_00;
  ScrollDecorator *this_01;
  
  pVVar1 = (VisualComponent *)operator_new(8);
  this = (VisualComponent *)operator_new(8);
  VisualComponent::VisualComponent(this);
  *(undefined ***)this = &PTR_Draw_00103d80;
  this_00 = (BorderDecorator *)operator_new(0x18);
  this_01 = (ScrollDecorator *)operator_new(0x10);
  ScrollDecorator::ScrollDecorator(this_01,this);
  BorderDecorator::BorderDecorator(this_00,(VisualComponent *)this_01,1);
  Window::SetContents(pVVar1);
  return 0;
}

Assistant:

int main()
{
    Window* window = new Window;
    TextView* textView = new TextView;

    window->SetContents(
        new BorderDecorator(
            new ScrollDecorator(textView), 1
        )
    );
}